

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O3

mat4 * __thiscall Camera::getViewMatrix(mat4 *__return_storage_ptr__,Camera *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  dVar4 = cos((double)(this->rotation).field_0.field_0.x);
  dVar5 = sin((double)((this->rotation).field_0.field_0.y + 3.1415927));
  dVar6 = sin((double)(this->rotation).field_0.field_0.x);
  dVar7 = cos((double)(this->rotation).field_0.field_0.x);
  dVar8 = cos((double)((this->rotation).field_0.field_0.y + 3.1415927));
  fVar9 = (float)(dVar5 * dVar4);
  fVar10 = (float)dVar6;
  fVar1 = (float)(dVar8 * dVar7);
  dVar4 = sin((double)((this->rotation).field_0.field_0.y + 3.1415927 + -1.5707964));
  dVar5 = cos((double)((this->rotation).field_0.field_0.y + 3.1415927 + -1.5707964));
  fVar2 = (this->rotation).field_0.field_0.z * 57.29578;
  fVar3 = cosf(fVar2);
  fVar2 = sinf(fVar2);
  fVar11 = (float)dVar4 * fVar3 + fVar2 * -0.0;
  fVar2 = (float)dVar4 * fVar2 + fVar3 * 0.0;
  fVar13 = fVar2 * fVar1 - fVar10 * (float)dVar5;
  fVar14 = (float)dVar5 * fVar9 - fVar11 * fVar1;
  fVar12 = fVar11 * fVar10 - fVar2 * fVar9;
  fVar2 = (this->position).field_0.field_0.x;
  fVar3 = (this->position).field_0.field_0.y;
  fVar11 = (this->position).field_0.field_0.z;
  fVar16 = (fVar9 + fVar2) - fVar2;
  fVar17 = (fVar10 + fVar3) - fVar3;
  fVar9 = (fVar1 + fVar11) - fVar11;
  fVar1 = 1.0 / SQRT(fVar9 * fVar9 + fVar17 * fVar17 + fVar16 * fVar16);
  fVar16 = fVar16 * fVar1;
  fVar17 = fVar17 * fVar1;
  fVar1 = fVar1 * fVar9;
  fVar10 = fVar17 * fVar12 - fVar1 * fVar14;
  fVar12 = fVar1 * fVar13 - fVar12 * fVar16;
  fVar13 = fVar14 * fVar16 - fVar13 * fVar17;
  fVar9 = 1.0 / SQRT(fVar13 * fVar13 + fVar12 * fVar12 + fVar10 * fVar10);
  fVar10 = fVar10 * fVar9;
  fVar12 = fVar12 * fVar9;
  fVar9 = fVar9 * fVar13;
  fVar13 = fVar12 * fVar1 - fVar9 * fVar17;
  fVar14 = fVar9 * fVar16 - fVar10 * fVar1;
  fVar15 = fVar10 * fVar17 - fVar12 * fVar16;
  __return_storage_ptr__->value[0].field_0.field_0.w = 0.0;
  __return_storage_ptr__->value[1].field_0.field_0.w = 0.0;
  __return_storage_ptr__->value[2].field_0.field_0.w = 0.0;
  __return_storage_ptr__->value[3].field_0.field_0.w = 1.0;
  __return_storage_ptr__->value[0].field_0.field_0.x = fVar10;
  __return_storage_ptr__->value[1].field_0.field_0.x = fVar12;
  __return_storage_ptr__->value[2].field_0.field_0.x = fVar9;
  __return_storage_ptr__->value[0].field_0.field_0.y = fVar13;
  __return_storage_ptr__->value[1].field_0.field_0.y = fVar14;
  __return_storage_ptr__->value[2].field_0.field_0.y = fVar15;
  __return_storage_ptr__->value[0].field_0.field_0.z = -fVar16;
  __return_storage_ptr__->value[1].field_0.field_0.z = -fVar17;
  __return_storage_ptr__->value[2].field_0.field_0.z = -fVar1;
  __return_storage_ptr__->value[3].field_0.field_0.x =
       -(fVar9 * fVar11 + fVar12 * fVar3 + fVar10 * fVar2);
  __return_storage_ptr__->value[3].field_0.field_0.y =
       -(fVar15 * fVar11 + fVar14 * fVar3 + fVar13 * fVar2);
  __return_storage_ptr__->value[3].field_0.field_0.z =
       fVar1 * fVar11 + fVar17 * fVar3 + fVar16 * fVar2;
  return __return_storage_ptr__;
}

Assistant:

glm::mat4 Camera::getViewMatrix()
{
	float halfPI = 1.57079632679f;
	glm::vec3 direction = glm::vec3(
		cos(rotation.x) * sin(rotation.y + 3.14159265359f),
		sin(rotation.x),
		cos(rotation.x) * cos(rotation.y + 3.14159265359f)
	);
	
	glm::vec3 right = glm::vec3(
		sin(rotation.y + 3.14159265359f - halfPI),
		0,
		cos(rotation.y + 3.14159265359f - halfPI)
	);
	right = glm::rotateZ(right, rotation.z*57.2957795f );

	glm::vec3 up = glm::cross(right, direction);

	glm::vec3 pos = glm::vec3(position.x, position.y, position.z);

	return glm::lookAt(
		pos,
		pos + direction,
		up
	);
}